

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O0

void ref_if_user_event(ALLEGRO_EVENT *event)

{
  long lVar1;
  uint *in_RDI;
  ALLEGRO_USER_EVENT_DESCRIPTOR *descr;
  
  if ((0x1ff < *in_RDI) && (lVar1 = *(long *)(in_RDI + 6), lVar1 != 0)) {
    _al_mutex_lock((_AL_MUTEX *)0x174618);
    *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
    _al_mutex_unlock((_AL_MUTEX *)0x174632);
  }
  return;
}

Assistant:

static void ref_if_user_event(ALLEGRO_EVENT *event)
{
   if (ALLEGRO_EVENT_TYPE_IS_USER(event->type)) {
      ALLEGRO_USER_EVENT_DESCRIPTOR *descr = event->user.__internal__descr;
      if (descr) {
         _al_mutex_lock(&user_event_refcount_mutex);
         descr->refcount++;
         _al_mutex_unlock(&user_event_refcount_mutex);
      }
   }
}